

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O1

void __thiscall bandit::reporter::info::summary(info *this)

{
  ostream *poVar1;
  long *plVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(&local_40);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Tests run: ",0xb);
  plVar2 = (long *)std::ostream::operator<<
                             ((ostream *)poVar1,
                              (this->super_colored_base).super_progress_base.specs_run_);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (0 < (this->super_colored_base).super_progress_base.specs_skipped_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[3])(&local_40);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Skipped: ",9);
    plVar2 = (long *)std::ostream::operator<<
                               ((ostream *)poVar1,
                                (this->super_colored_base).super_progress_base.specs_skipped_);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  if (0 < (this->super_colored_base).super_progress_base.specs_succeeded_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[2])(&local_40);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Passed: ",8);
    plVar2 = (long *)std::ostream::operator<<
                               ((ostream *)poVar1,
                                (this->super_colored_base).super_progress_base.specs_succeeded_);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  if (0 < (this->super_colored_base).super_progress_base.specs_failed_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_40);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Failed: ",8);
    plVar2 = (long *)std::ostream::operator<<
                               ((ostream *)poVar1,
                                (this->super_colored_base).super_progress_base.specs_failed_);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  if ((this->super_colored_base).super_progress_base.test_run_errors_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_40);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Errors: ",8);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_40);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void summary() {
        stm_
            << colorizer_.emphasize()
            << "Tests run: " << specs_run_
            << std::endl;
        if (specs_skipped_ > 0) {
          stm_
              << colorizer_.neutral()
              << "Skipped: " << specs_skipped_
              << std::endl;
        }
        if (specs_succeeded_ > 0) {
          stm_
              << colorizer_.good()
              << "Passed: " << specs_succeeded_
              << std::endl;
        }
        if (specs_failed_ > 0) {
          stm_
              << colorizer_.bad()
              << "Failed: " << specs_failed_
              << std::endl;
        }
        if (test_run_errors_.size() > 0) {
          stm_
              << colorizer_.bad()
              << "Errors: " << test_run_errors_.size()
              << std::endl;
        }
        stm_
            << colorizer_.reset()
            << std::endl;
      }